

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_5bbd1::PyIterCtrlPMatchSource<cpsm::FilenameOnlyMatch>::PyIterCtrlPMatchSource
          (PyListCtrlPMatchSource<cpsm::FullLineMatch> *this,PyObject *iter)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 in_RSI;
  char *in_RDI;
  Error *in_stack_ffffffffffffffe0;
  
  std::mutex::mutex((mutex *)0x13d3dd);
  *(undefined8 *)(in_RDI + 0x28) = in_RSI;
  in_RDI[0x30] = '\0';
  iVar1 = PyIter_Check(in_RSI);
  if (iVar1 == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    cpsm::Error::Error<char_const*>(in_stack_ffffffffffffffe0,in_RDI);
    __cxa_throw(uVar2,&cpsm::Error::typeinfo,cpsm::Error::~Error);
  }
  return;
}

Assistant:

explicit PyIterCtrlPMatchSource(PyObject* const iter) : iter_(iter) {
    if (!PyIter_Check(iter)) {
      throw cpsm::Error("input is not iterable");
    }
  }